

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionBaseName
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  bool bVar1;
  Kind KVar2;
  char *pcVar3;
  Node *local_30;
  Node *Name;
  size_t *N_local;
  char *Buf_local;
  ItaniumPartialDemangler *this_local;
  
  bVar1 = isFunction(this);
  if (!bVar1) {
    return (char *)0x0;
  }
  local_30 = anon_unknown.dwarf_32f1a0::FunctionEncoding::getName
                       ((FunctionEncoding *)this->RootNode);
  do {
    KVar2 = anon_unknown.dwarf_32f1a0::Node::getKind(local_30);
    switch(KVar2) {
    case KAbiTagAttr:
      local_30 = (Node *)local_30[1]._vptr_Node;
      break;
    default:
      pcVar3 = printNode(local_30,Buf,N);
      return pcVar3;
    case KNestedName:
      local_30 = *(Node **)&local_30[1].K;
      break;
    case KLocalName:
      local_30 = *(Node **)&local_30[1].K;
      break;
    case KNameWithTemplateArgs:
      local_30 = (Node *)local_30[1]._vptr_Node;
      break;
    case KStdQualifiedName:
      local_30 = (Node *)local_30[1]._vptr_Node;
    }
  } while( true );
}

Assistant:

char *ItaniumPartialDemangler::getFunctionBaseName(char *Buf, size_t *N) const {
  if (!isFunction())
    return nullptr;

  Node *Name = static_cast<FunctionEncoding *>(RootNode)->getName();

  while (true) {
    switch (Name->getKind()) {
    case Node::KAbiTagAttr:
      Name = static_cast<AbiTagAttr *>(Name)->Base;
      continue;
    case Node::KStdQualifiedName:
      Name = static_cast<StdQualifiedName *>(Name)->Child;
      continue;
    case Node::KNestedName:
      Name = static_cast<NestedName *>(Name)->Name;
      continue;
    case Node::KLocalName:
      Name = static_cast<LocalName *>(Name)->Entity;
      continue;
    case Node::KNameWithTemplateArgs:
      Name = static_cast<NameWithTemplateArgs *>(Name)->Name;
      continue;
    default:
      return printNode(Name, Buf, N);
    }
  }
}